

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::AddLinkEntries<cmLinkImplItem>
          (cmComputeLinkDepends *this,int depender_index,
          vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libs)

{
  size_t this_00;
  bool bVar1;
  __type _Var2;
  string *__lhs;
  string *__rhs;
  ulong uVar3;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_01;
  reference pvVar4;
  reference ppVar5;
  reference ppDVar6;
  pair<const_int,_cmComputeLinkDepends::DependSet> *dependSet_1;
  iterator __end1;
  iterator __begin1;
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  *__range1_1;
  pair<const_int,_cmComputeLinkDepends::DependSet> *dependSet;
  iterator __end2;
  iterator __begin2;
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  *__range2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  bool local_89;
  int local_88 [2];
  int dependee_index;
  reference local_78;
  cmLinkItem *item;
  cmLinkImplItem *l;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range1;
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  dependSets;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libs_local;
  int depender_index_local;
  cmComputeLinkDepends *this_local;
  
  dependSets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)libs;
  std::
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  ::map((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
         *)&__range1);
  this_00 = dependSets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end0 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                     ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)
                      dependSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  l = (cmLinkImplItem *)
      std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                     *)&l), bVar1) {
    local_78 = __gnu_cxx::
               __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
               ::operator*(&__end0);
    item = &local_78->super_cmLinkItem;
    __lhs = cmLinkItem::AsStr_abi_cxx11_(&local_78->super_cmLinkItem);
    __rhs = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    _Var2 = std::operator==(__lhs,__rhs);
    if (!_Var2) {
      cmLinkItem::AsStr_abi_cxx11_(&local_78->super_cmLinkItem);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_88[0] = AddLinkEntry(this,item);
        if (depender_index < 0) {
          std::vector<int,_std::allocator<int>_>::push_back(&this->OriginalEntries,local_88);
        }
        else {
          this_01 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                    std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                              (&(this->EntryConstraintGraph).
                                super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                               (long)depender_index);
          local_89 = false;
          __range2 = (map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                      *)0x0;
          _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__range2);
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<int&,bool,cmListFileBacktrace>
                    (this_01,local_88,&local_89,(cmListFileBacktrace *)&__range2);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__range2);
        }
        __end2 = std::
                 map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                 ::begin((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                          *)&__range1);
        dependSet = (pair<const_int,_cmComputeLinkDepends::DependSet> *)
                    std::
                    map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                    ::end((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                           *)&__range1);
        while (bVar1 = std::operator!=(&__end2,(_Self *)&dependSet), bVar1) {
          ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::
                   operator*(&__end2);
          pvVar4 = std::
                   vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                   ::operator[](&this->EntryList,(long)local_88[0]);
          if (((pvVar4->Target == (cmGeneratorTarget *)0x0) &&
              (pvVar4 = std::
                        vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                        ::operator[](&this->EntryList,(long)local_88[0]), (pvVar4->IsFlag & 1U) == 0
              )) && (local_88[0] != ppVar5->first)) {
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      (&(ppVar5->second).super_set<int,_std::less<int>,_std::allocator<int>_>,
                       local_88);
          }
          std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::operator++
                    (&__end2);
        }
        ppDVar6 = std::
                  vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
                  ::operator[](&this->InferredDependSets,(long)local_88[0]);
        if (*ppDVar6 != (value_type)0x0) {
          std::
          map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
          ::operator[]((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                        *)&__range1,local_88);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
    ::operator++(&__end0);
  }
  __end1 = std::
           map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
           ::begin((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                    *)&__range1);
  dependSet_1 = (pair<const_int,_cmComputeLinkDepends::DependSet> *)
                std::
                map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                ::end((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                       *)&__range1);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&dependSet_1), bVar1) {
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::
             operator*(&__end1);
    ppDVar6 = std::
              vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
              ::operator[](&this->InferredDependSets,(long)ppVar5->first);
    std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>::
    push_back(&(*ppDVar6)->
               super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
              ,&ppVar5->second);
    std::_Rb_tree_iterator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>::operator++
              (&__end1);
  }
  std::
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  ::~map((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
          *)&__range1);
  return;
}

Assistant:

void cmComputeLinkDepends::AddLinkEntries(int depender_index,
                                          std::vector<T> const& libs)
{
  // Track inferred dependency sets implied by this list.
  std::map<int, DependSet> dependSets;

  // Loop over the libraries linked directly by the depender.
  for (T const& l : libs) {
    // Skip entries that will resolve to the target getting linked or
    // are empty.
    cmLinkItem const& item = l;
    if (item.AsStr() == this->Target->GetName() || item.AsStr().empty()) {
      continue;
    }

    // Add a link entry for this item.
    int dependee_index = this->AddLinkEntry(l);

    // The dependee must come after the depender.
    if (depender_index >= 0) {
      this->EntryConstraintGraph[depender_index].emplace_back(
        dependee_index, false, cmListFileBacktrace());
    } else {
      // This is a direct dependency of the target being linked.
      this->OriginalEntries.push_back(dependee_index);
    }

    // Update the inferred dependencies for earlier items.
    for (auto& dependSet : dependSets) {
      // Add this item to the inferred dependencies of other items.
      // Target items are never inferred dependees because unknown
      // items are outside libraries that should not be depending on
      // targets.
      if (!this->EntryList[dependee_index].Target &&
          !this->EntryList[dependee_index].IsFlag &&
          dependee_index != dependSet.first) {
        dependSet.second.insert(dependee_index);
      }
    }

    // If this item needs to have dependencies inferred, do so.
    if (this->InferredDependSets[dependee_index]) {
      // Make sure an entry exists to hold the set for the item.
      dependSets[dependee_index];
    }
  }

  // Store the inferred dependency sets discovered for this list.
  for (auto const& dependSet : dependSets) {
    this->InferredDependSets[dependSet.first]->push_back(dependSet.second);
  }
}